

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O0

void __thiscall SSD1306::OledBitmap<16,_16>::xorPixel(OledBitmap<16,_16> *this,OledPoint p)

{
  OledPoint p_00;
  OledPoint p_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  OledPixel *in_RDI;
  PixelOffset offset;
  PixelOffset *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined1 local_24;
  
  p_01.m_y = in_stack_ffffffffffffffd4;
  p_01.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside(in_RDI,p_01);
  if (bVar1) {
    p_00.m_y = in_stack_ffffffffffffffc4;
    p_00.m_x = in_stack_ffffffffffffffc0;
    PixelOffset::PixelOffset(in_stack_ffffffffffffffb8,p_00);
    std::array<std::array<unsigned_char,_2UL>,_16UL>::operator[]
              ((array<std::array<unsigned_char,_2UL>,_16UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (size_type)in_stack_ffffffffffffffb8);
    pbVar5 = std::array<unsigned_char,_2UL>::operator[]
                       ((array<unsigned_char,_2UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (size_type)in_stack_ffffffffffffffb8);
    if (((uint)*pbVar5 & 1 << (local_24 & 0x1f)) == 0) {
      iVar4 = 1 << (local_24 & 0x1f);
      std::array<std::array<unsigned_char,_2UL>,_16UL>::operator[]
                ((array<std::array<unsigned_char,_2UL>,_16UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,iVar4),(size_type)in_stack_ffffffffffffffb8);
      pbVar5 = std::array<unsigned_char,_2UL>::operator[]
                         ((array<unsigned_char,_2UL> *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                          (size_type)in_stack_ffffffffffffffb8);
      *pbVar5 = *pbVar5 | (byte)iVar4;
    }
    else {
      uVar2 = 1 << (local_24 & 0x1f);
      uVar3 = uVar2 ^ 0xffffffff;
      std::array<std::array<unsigned_char,_2UL>,_16UL>::operator[]
                ((array<std::array<unsigned_char,_2UL>,_16UL> *)
                 (CONCAT44(uVar2,in_stack_ffffffffffffffc0) ^ 0xffffffff00000000),
                 (size_type)in_stack_ffffffffffffffb8);
      pbVar5 = std::array<unsigned_char,_2UL>::operator[]
                         ((array<unsigned_char,_2UL> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                          (size_type)in_stack_ffffffffffffffb8);
      *pbVar5 = *pbVar5 & (byte)uVar3;
    }
  }
  return;
}

Assistant:

void
    xorPixel(
        SSD1306::OledPoint p) override
    {

        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        if (blocks_[offset.block][offset.byte] & (1 << offset.bit))
        {
            blocks_[offset.block][offset.byte] &= ~(1 << offset.bit);
        }
        else
        {
            blocks_[offset.block][offset.byte] |= (1 << offset.bit);
        }
    }